

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

void __thiscall
ON_SimpleArray<ON_MeshNgon_*>::Insert(ON_SimpleArray<ON_MeshNgon_*> *this,int i,ON_MeshNgon **x)

{
  int iVar1;
  ON_MeshNgon **memblock;
  uint uVar2;
  
  if (-1 < i) {
    uVar2 = this->m_count;
    if (i <= (int)uVar2) {
      memblock = x;
      if (uVar2 == this->m_capacity) {
        if (x < this->m_a + uVar2 && this->m_a <= x) {
          memblock = (ON_MeshNgon **)onmalloc(8);
          *memblock = *x;
        }
        iVar1 = NewCapacity(this);
        Reserve(this,(long)iVar1);
        uVar2 = this->m_count;
      }
      this->m_count = uVar2 + 1;
      Move(this,i + 1,i,uVar2 - i);
      this->m_a[(uint)i] = *memblock;
      if (memblock != x) {
        onfree(memblock);
        return;
      }
    }
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Insert( int i, const T& x ) 
{
  if( i >= 0 && i <= m_count ) 
  {
    const T* p = &x;
    if ( m_count == m_capacity ) 
    {
      if (&x >= m_a && &x < (m_a + m_capacity))
      {
        // x is in the block of memory about to be reallocated.
        void* temp = onmalloc(sizeof(T));
        memcpy(temp, p, sizeof(T));
        p = (T*)temp;
      }
      int newcapacity = NewCapacity();
      Reserve( newcapacity );
    }
	  m_count++;
    Move( i+1, i, m_count-1-i );
	  m_a[i] = *p;
    if (p != &x)
      onfree((void*)p);
  }
}